

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_BigSphere.cpp
# Opt level: O0

bool __thiscall
sch::STP_BigSphere::isHereFirstNeighbourPrime(STP_BigSphere *this,Vector3 *v,int idp)

{
  Scalar SVar1;
  int idp_local;
  Vector3 *v_local;
  STP_BigSphere *this_local;
  
  if (((this->m_VVR0).m_outerSTP != idp) &&
     (SVar1 = s_STP_VVR::isInsidePlane(&this->m_VVR0,v), SVar1 < 0.0)) {
    (this->super_STP_Feature).m_nextBVPrime = (this->m_VVR0).m_outerSTP;
    return false;
  }
  if (((this->m_VVR1).m_outerSTP != idp) &&
     (SVar1 = s_STP_VVR::isInsidePlane(&this->m_VVR1,v), SVar1 < 0.0)) {
    (this->super_STP_Feature).m_nextBVPrime = (this->m_VVR1).m_outerSTP;
    return false;
  }
  if (((this->m_VVR2).m_outerSTP != idp) &&
     (SVar1 = s_STP_VVR::isInsidePlane(&this->m_VVR2,v), SVar1 < 0.0)) {
    (this->super_STP_Feature).m_nextBVPrime = (this->m_VVR2).m_outerSTP;
    return false;
  }
  return true;
}

Assistant:

bool STP_BigSphere::isHereFirstNeighbourPrime(const Vector3 & v, int idp)
{
  //	std::cout << "test is here big sphere" << std::endl;
  if((m_VVR0.m_outerSTP != idp) && (m_VVR0.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR0.m_outerSTP;
    return false;
  }
  if((m_VVR1.m_outerSTP != idp) && (m_VVR1.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR1.m_outerSTP;
    return false;
  }
  if((m_VVR2.m_outerSTP != idp) && (m_VVR2.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR2.m_outerSTP;
    return false;
  }
  return true;
}